

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBuilderBeamEuler::BuildBeam
          (ChBuilderBeamEuler *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionEuler> *sect,int N,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *nodeA,ChVector<double> *B,ChVector<double> *Ydir
          )

{
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *this_00;
  undefined8 *puVar1;
  element_type *peVar2;
  ChMesh *pCVar3;
  long lVar4;
  _func_int *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  undefined1 auVar11 [16];
  shared_ptr<chrono::fea::ChMesh> *psVar12;
  ChNodeFEAxyzrot *this_01;
  pointer psVar13;
  ChVector<double> *mv;
  long lVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  double dVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  ChMatrix33<double> mrot;
  shared_ptr<chrono::fea::ChElementBeamEuler> element;
  ChVector<double> v;
  value_type local_328;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> *local_310;
  undefined1 local_308 [32];
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  element_type *local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  undefined8 local_258;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_250;
  undefined8 local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_240;
  shared_ptr<chrono::fea::ChElementBase> local_238;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_228;
  long local_210;
  _func_int **local_208;
  double local_200;
  shared_ptr<chrono::fea::ChBeamSectionEuler> *local_1f8;
  ChBuilderBeamEuler *local_1f0;
  shared_ptr<chrono::fea::ChMesh> *local_1e8;
  ChMatrix33<double> local_1e0;
  ChFrame<double> local_198;
  undefined1 local_108 [16];
  ChVector<double> local_f8;
  undefined1 local_d8 [32];
  ChFrame<double> local_b8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  local_1f8 = sect;
  local_1e8 = mesh;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
  ::clear(&this->beam_elems);
  this_00 = &this->beam_nodes;
  local_1f0 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(this_00);
  peVar2 = (nodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  dVar61 = B->m_data[0] - *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20;
  auVar17 = vsubpd_avx(*(undefined1 (*) [16])(B->m_data + 1),
                       *(undefined1 (*) [16])&peVar2->field_0x28);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  uVar20 = vcmppd_avx512vl(auVar17,ZEXT816(0) << 0x40,0);
  if ((byte)((byte)(uVar20 & 3) & dVar61 == 0.0 & (byte)((uVar20 & 3) >> 1)) == 0) {
    dVar49 = auVar17._0_8_;
    auVar17 = vshufpd_avx(auVar17,auVar17,1);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar49 * dVar49;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar61;
    auVar16 = vfmadd231sd_fma(auVar18,auVar43,auVar43);
    auVar16 = vfmadd231sd_fma(auVar16,auVar17,auVar17);
    auVar16 = vsqrtsd_avx(auVar16,auVar16);
    bVar10 = 2.2250738585072014e-308 <= auVar16._0_8_;
    dVar54 = 1.0 / auVar16._0_8_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (ulong)bVar10 * (long)(auVar17._0_8_ * dVar54);
    local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (double)((ulong)bVar10 * (long)(dVar49 * dVar54));
    auVar17._0_8_ = (ulong)bVar10 * (long)(dVar61 * dVar54) + (ulong)!bVar10 * 0x3ff0000000000000;
    auVar17._8_8_ = 0;
  }
  else {
    auVar17 = ZEXT816(0x3ff0000000000000);
    auVar16 = ZEXT816(0) << 0x40;
  }
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = Ydir->m_data[2];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = Ydir->m_data[0];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = Ydir->m_data[1];
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar17._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar16._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       Ydir->m_data[2] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar18 = vfmsub231sd_fma(auVar55,auVar16,auVar69);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       Ydir->m_data[1] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar43 = vfmsub231sd_fma(auVar50,auVar11,auVar62);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar43._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       Ydir->m_data[0] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar44 = vfmsub231sd_fma(auVar44,auVar17,auVar65);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar44._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar18._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar18 = vfmadd231sd_fma(auVar72,auVar43,auVar43);
  auVar18 = vfmadd231sd_fma(auVar18,auVar44,auVar44);
  auVar18 = vsqrtsd_avx(auVar18,auVar18);
  dVar61 = auVar18._0_8_;
  if (0.0001 <= dVar61) goto LAB_005e114c;
  auVar7._8_8_ = 0x7fffffffffffffff;
  auVar7._0_8_ = 0x7fffffffffffffff;
  auVar18 = vandpd_avx512vl(auVar69,auVar7);
  if (0.9 <= auVar18._0_8_) {
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    auVar18 = vandpd_avx512vl(auVar65,auVar8);
    if (0.9 <= auVar18._0_8_) {
      auVar9._8_8_ = 0x7fffffffffffffff;
      auVar9._0_8_ = 0x7fffffffffffffff;
      auVar18 = vandpd_avx512vl(auVar62,auVar9);
      auVar43 = ZEXT816(0);
      if (0.9 <= auVar18._0_8_) goto LAB_005e1116;
      auVar18 = ZEXT816(0x3ff0000000000000);
    }
    else {
      auVar43 = ZEXT816(0x3ff0000000000000);
LAB_005e1116:
      auVar18 = ZEXT816(0);
    }
    auVar44 = ZEXT816(0);
  }
  else {
    auVar44 = ZEXT816(0x3ff0000000000000);
    auVar18 = ZEXT816(0);
    auVar43 = ZEXT816(0);
  }
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       auVar18._0_8_ *
       -local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar50 = vfmadd231sd_fma(auVar56,auVar16,auVar44);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       auVar43._0_8_ *
       -local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar18 = vfmadd231sd_fma(auVar51,auVar11,auVar18);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar18._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       auVar44._0_8_ *
       -local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar43 = vfmadd231sd_fma(auVar45,auVar17,auVar43);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar43._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar50._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar18 = vfmadd231sd_fma(auVar63,auVar18,auVar18);
  auVar18 = vfmadd231sd_fma(auVar18,auVar43,auVar43);
  auVar18 = vsqrtsd_avx(auVar18,auVar18);
  dVar61 = auVar18._0_8_;
LAB_005e114c:
  dVar61 = 1.0 / dVar61;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
       dVar61;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar61;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
       dVar61;
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar16 = vfmsub231sd_fma(auVar64,auVar57,auVar16);
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar17 = vfmsub231sd_fma(auVar66,auVar46,auVar17);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar18 = vfmsub231sd_fma(auVar70,auVar52,auVar11);
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar16._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar17._0_8_;
  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar18._0_8_;
  local_310 = nodeA;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(this_00,nodeA);
  if (0 < N) {
    local_200 = (double)N;
    local_210 = (ulong)(uint)N << 4;
    iVar15 = 1;
    lVar14 = 0;
    local_208 = (_func_int **)&PTR__ChFrame_00b03780;
    do {
      dVar61 = (double)iVar15 / local_200;
      mv = &local_f8;
      peVar2 = (local_310->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_f8.m_data[2] = *(double *)&peVar2->field_0x30;
      auVar17 = *(undefined1 (*) [16])&(peVar2->super_ChNodeFEAbase).field_0x20;
      auVar16 = vsubpd_avx(*(undefined1 (*) [16])B->m_data,auVar17);
      local_f8.m_data[2] = local_f8.m_data[2] + dVar61 * (B->m_data[2] - local_f8.m_data[2]);
      local_f8.m_data[0] = auVar17._0_8_ + dVar61 * auVar16._0_8_;
      local_f8.m_data[1] = auVar17._8_8_ + dVar61 * auVar16._8_8_;
      ChFrame<double>::ChFrame(&local_b8,mv,&local_1e0);
      this_01 = (ChNodeFEAxyzrot *)
                ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)mv);
      local_198._vptr_ChFrame = local_208;
      local_198.coord.pos.m_data[0] = local_b8.coord.pos.m_data[0];
      local_198.coord.pos.m_data[1] = local_b8.coord.pos.m_data[1];
      local_198.coord.pos.m_data[2] = local_b8.coord.pos.m_data[2];
      local_198.coord.rot.m_data[0] = local_b8.coord.rot.m_data[0];
      local_198.coord.rot.m_data[1] = local_b8.coord.rot.m_data[1];
      local_198.coord.rot.m_data[2] = local_b8.coord.rot.m_data[2];
      local_198.coord.rot.m_data[3] = local_b8.coord.rot.m_data[3];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      local_198.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      ChNodeFEAxyzrot::ChNodeFEAxyzrot(this_01,&local_198);
      local_328.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
                (&local_328.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_01);
      psVar12 = local_1e8;
      pCVar3 = (local_1e8->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_228.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(local_328.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_ChNodeFEAbase;
      local_228.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_328.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_328.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_328.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_328.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_328.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_328.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddNode(pCVar3,&local_228);
      if (local_228.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.
                   super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(this_00,&local_328);
      local_198._vptr_ChFrame = (_func_int **)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementBeamEuler,std::allocator<chrono::fea::ChElementBeamEuler>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198.coord,
                 (ChElementBeamEuler **)&local_198,
                 (allocator<chrono::fea::ChElementBeamEuler> *)&local_b8);
      pCVar3 = (psVar12->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_238.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_198._vptr_ChFrame;
      local_238.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198.coord.pos.m_data[0];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198.coord.pos.m_data[0] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)local_198.coord.pos.m_data[0] + 8) =
               *(_Atomic_word *)((long)local_198.coord.pos.m_data[0] + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)local_198.coord.pos.m_data[0] + 8) =
               *(_Atomic_word *)((long)local_198.coord.pos.m_data[0] + 8) + 1;
        }
      }
      ChMesh::AddElement(pCVar3,&local_238);
      if (local_238.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_238.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
      ::push_back(&local_1f0->beam_elems,(value_type *)&local_198);
      psVar13 = (this_00->
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)
               ((long)&(psVar13->
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr + lVar14);
      local_248 = *puVar1;
      p_Stack_240 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
      lVar4 = *(long *)((long)&(psVar13->
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                               )._M_refcount._M_pi + lVar14);
      if (lVar4 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
          UNLOCK();
          psVar13 = (this_00->
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
        }
      }
      puVar1 = (undefined8 *)
               ((long)&psVar13[1].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar14);
      local_258 = *puVar1;
      p_Stack_250 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
      lVar4 = *(long *)((long)&psVar13[1].
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + lVar14);
      if (lVar4 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
        }
      }
      (*(*(_func_int ***)local_198._vptr_ChFrame)[0x1a])
                (local_198._vptr_ChFrame,&local_248,&local_258);
      if (p_Stack_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_250);
      }
      if (p_Stack_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_240);
      }
      auVar67._8_8_ = 0;
      auVar67._0_8_ =
           local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar58._8_8_ =
           local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar58._0_8_ =
           local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar73._8_8_ = 0;
      auVar73._0_8_ =
           local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      dVar61 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0] + local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[4] +
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
      if (0.0 <= dVar61) {
        dVar61 = dVar61 + 1.0;
        if (dVar61 < 0.0) {
          local_288._0_16_ = auVar58;
          local_2a8._0_16_ = auVar67;
          local_2c8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          local_2e8._0_16_ = auVar73;
          local_308._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          auVar30._0_8_ = sqrt(dVar61);
          auVar30._8_56_ = extraout_var;
          auVar17 = auVar30._0_16_;
          auVar73 = local_2e8._0_16_;
          dVar61 = (double)local_308._0_8_;
          auVar67 = local_2a8._0_16_;
          auVar58 = local_288._0_16_;
          dVar49 = (double)local_2c8._0_8_;
        }
        else {
          auVar22._8_8_ = 0;
          auVar22._0_8_ = dVar61;
          auVar17 = vsqrtsd_avx(auVar22,auVar22);
          dVar61 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
          dVar49 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
        }
        auVar47._8_8_ = 0x3fe0000000000000;
        auVar47._0_8_ = 0x3fe0000000000000;
        auVar16 = vunpcklpd_avx(auVar73,auVar67);
        auVar16 = vsubpd_avx(auVar16,auVar58);
        auVar34._0_8_ = 0.5 / auVar17._0_8_;
        auVar34._8_8_ = auVar34._0_8_;
        auVar42 = ZEXT1632(CONCAT88(auVar16._8_8_ * auVar34._0_8_,auVar16._0_8_ * auVar34._0_8_));
        auVar35 = vunpcklpd_avx(auVar47,auVar34);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = dVar61 - dVar49;
        auVar26 = vunpcklpd_avx(auVar17,auVar36);
      }
      else if (local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] <= local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[0]) {
        if (local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] <
            local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8])
        goto LAB_005e1569;
        dVar61 = ((local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0] -
                  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4]) -
                 local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8]) + 1.0;
        if (dVar61 < 0.0) {
          local_288._0_16_ = auVar58;
          local_2a8._0_16_ = auVar67;
          local_2c8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          local_2e8._0_16_ = auVar73;
          local_308._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          auVar33._0_8_ = sqrt(dVar61);
          auVar33._8_56_ = extraout_var_02;
          auVar17 = auVar33._0_16_;
          dVar61 = (double)local_308._0_8_;
          auVar73 = local_2e8._0_16_;
          dVar49 = (double)local_2a8._0_8_;
          auVar58 = local_288._0_16_;
          dVar54 = (double)local_2c8._0_8_;
        }
        else {
          auVar24._8_8_ = 0;
          auVar24._0_8_ = dVar61;
          auVar17 = vsqrtsd_avx(auVar24,auVar24);
          dVar61 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
          dVar49 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
          dVar54 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
        }
        auVar35._0_8_ = 0.5 / auVar17._0_8_;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = dVar54 + dVar61;
        auVar17 = vunpcklpd_avx(auVar17,auVar40);
        auVar41._8_8_ = 0x3fe0000000000000;
        auVar41._0_8_ = 0x3fe0000000000000;
        auVar35._8_8_ = auVar35._0_8_;
        auVar16 = vunpcklpd_avx(auVar41,auVar35);
        auVar42 = ZEXT1632(CONCAT88(auVar17._8_8_ * auVar16._8_8_,auVar17._0_8_ * auVar16._0_8_));
        auVar17 = vsubpd_avx(auVar73,auVar58);
        auVar26._8_8_ = dVar49 + auVar58._8_8_;
        auVar26._0_8_ = auVar17._0_8_;
      }
      else if (local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] < local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8]) {
LAB_005e1569:
        dVar61 = ((local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8] -
                  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[0]) -
                 local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4]) + 1.0;
        if (dVar61 < 0.0) {
          local_288._0_16_ = auVar58;
          local_2a8._0_16_ = auVar67;
          local_2c8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          local_2e8._0_16_ = auVar73;
          local_308._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          auVar31._0_8_ = sqrt(dVar61);
          auVar31._8_56_ = extraout_var_00;
          auVar17 = auVar31._0_16_;
          auVar73 = local_2e8._0_16_;
          dVar61 = (double)local_308._0_8_;
          auVar67 = local_2a8._0_16_;
          auVar58 = local_288._0_16_;
          dVar49 = (double)local_2c8._0_8_;
        }
        else {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = dVar61;
          auVar17 = vsqrtsd_avx(auVar23,auVar23);
          dVar61 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
          dVar49 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
        }
        auVar18 = vunpcklpd_avx(auVar67,auVar73);
        auVar16 = vshufpd_avx(auVar58,auVar58,1);
        auVar35._0_8_ = 0.5 / auVar17._0_8_;
        auVar42 = ZEXT1632(CONCAT88((auVar16._8_8_ + auVar18._8_8_) * auVar35._0_8_,
                                    (auVar16._0_8_ + auVar18._0_8_) * auVar35._0_8_));
        auVar35._8_8_ = 0x3fe0000000000000;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = dVar61 - dVar49;
        auVar26 = vunpcklpd_avx(auVar37,auVar17);
      }
      else {
        dVar61 = ((local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4] -
                  local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8]) -
                 local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0]) + 1.0;
        if (dVar61 < 0.0) {
          local_288._0_16_ = auVar58;
          local_2a8._0_16_ = auVar67;
          local_2c8._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [1];
          local_2e8._0_16_ = auVar73;
          local_308._0_8_ =
               local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
          auVar32._0_8_ = sqrt(dVar61);
          auVar32._8_56_ = extraout_var_01;
          auVar17 = auVar32._0_16_;
          dVar61 = (double)local_308._0_8_;
          auVar73 = local_2e8._0_16_;
          dVar49 = (double)local_2a8._0_8_;
          auVar58 = local_288._0_16_;
          dVar54 = (double)local_2c8._0_8_;
        }
        else {
          auVar21._8_8_ = 0;
          auVar21._0_8_ = dVar61;
          auVar17 = vsqrtsd_avx(auVar21,auVar21);
          dVar61 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
          dVar49 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
          dVar54 = local_1e0.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
        }
        auVar35._0_8_ = 0.5 / auVar17._0_8_;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = dVar54 + dVar61;
        auVar17 = vunpcklpd_avx(auVar38,auVar17);
        auVar35._8_8_ = auVar35._0_8_;
        auVar42 = ZEXT1632(CONCAT88(auVar17._8_8_ * 0.5,auVar17._0_8_ * auVar35._0_8_));
        auVar25._8_8_ = dVar49;
        auVar25._0_8_ = dVar49;
        auVar39._0_8_ = auVar73._0_8_ + auVar58._0_8_;
        auVar39._8_8_ = auVar73._8_8_ + auVar58._8_8_;
        auVar17 = vsubpd_avx(auVar25,auVar58);
        auVar26 = vshufpd_avx(auVar17,auVar39,1);
      }
      auVar17 = auVar42._0_16_;
      auVar59._0_8_ = auVar26._0_8_ * auVar35._0_8_;
      auVar59._8_8_ = auVar26._8_8_ * auVar35._8_8_;
      p_Var5 = *((element_type *)(local_198._vptr_ChFrame + 0x17))->_vptr_ChElementBase;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((element_type *)(local_198._vptr_ChFrame + 0x17))->_vptr_ChElementBase[1];
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      auVar16 = vshufpd_avx(auVar59,auVar59,1);
      auVar48._24_8_ = *(undefined8 *)(p_Var5 + 0x40);
      auVar48._16_8_ = *(undefined8 *)(p_Var5 + 0x40);
      auVar74._8_8_ = auVar59._0_8_;
      auVar74._0_8_ = auVar59._0_8_;
      auVar74._16_8_ = auVar59._0_8_;
      auVar74._24_8_ = auVar59._0_8_;
      auVar68._0_8_ = auVar42._0_8_ ^ 0x8000000000000000;
      auVar68._8_8_ = auVar42._8_8_ ^ 0x8000000000000000;
      uVar20 = auVar16._0_8_ ^ 0x8000000000000000;
      auVar29 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])(p_Var5 + 0x48)),0x15);
      auVar16 = vunpcklpd_avx(auVar17,auVar68);
      auVar18 = vshufpd_avx(auVar68,auVar68,1);
      auVar71._8_8_ = uVar20;
      auVar71._0_8_ = uVar20;
      auVar71._16_8_ = uVar20;
      auVar71._24_8_ = uVar20;
      auVar19._16_16_ = auVar18;
      auVar19._0_16_ = auVar16;
      auVar19 = vblendpd_avx(auVar19,auVar71,8);
      auVar48._8_8_ = *(undefined8 *)(p_Var5 + 0x48);
      auVar48._0_8_ = *(undefined8 *)(p_Var5 + 0x48);
      auVar60 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])(p_Var5 + 0x38)),1);
      auVar27._0_8_ = auVar19._0_8_ * auVar60._0_8_;
      auVar27._8_8_ = auVar19._8_8_ * auVar60._8_8_;
      auVar27._16_8_ = auVar19._16_8_ * auVar60._16_8_;
      auVar27._24_8_ = auVar19._24_8_ * auVar60._24_8_;
      auVar43 = vfmadd231pd_fma(auVar27,auVar74,*(undefined1 (*) [32])(p_Var5 + 0x38));
      auVar19 = vpermpd_avx2(auVar42,0x55);
      auVar60 = ZEXT1632(auVar59);
      auVar19 = vblendpd_avx(auVar19,auVar60,2);
      auVar19 = vblendpd_avx(auVar19,auVar71,4);
      auVar43 = vfmadd213pd_fma(auVar48,auVar19,ZEXT1632(auVar43));
      auVar19 = vpermt2pd_avx512f(_DAT_0096b5c0,auVar60);
      auVar43 = vfmadd213pd_fma(auVar19,auVar29,ZEXT1632(auVar43));
      *(undefined1 (*) [32])(local_198._vptr_ChFrame + 0x22) = ZEXT1632(auVar43);
      auVar19 = ZEXT1632(auVar68);
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_2c8 = ZEXT1632(auVar68);
        local_308 = ZEXT1632(auVar16);
        local_2e8 = auVar71;
        local_2a8 = auVar60;
        local_288 = auVar42;
        local_108 = auVar18;
        local_d8 = auVar74;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        auVar16 = local_308._0_16_;
        auVar59 = local_2a8._0_16_;
        auVar17 = local_288._0_16_;
        auVar71 = local_2e8;
        auVar18 = local_108;
        auVar74 = local_d8;
        auVar19 = local_2c8;
      }
      p_Var5 = ((element_type *)(local_198._vptr_ChFrame + 0x17))->_vptr_ChElementBase[2];
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((element_type *)(local_198._vptr_ChFrame + 0x17))->_vptr_ChElementBase[3];
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      auVar42._16_16_ = auVar18;
      auVar42._0_16_ = auVar16;
      auVar53._8_8_ = *(undefined8 *)(p_Var5 + 0x48);
      auVar53._0_8_ = *(undefined8 *)(p_Var5 + 0x48);
      auVar42 = vblendpd_avx(auVar42,auVar71,8);
      auVar29 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])(p_Var5 + 0x38)),1);
      auVar60 = vpermpd_avx2(ZEXT1632(*(undefined1 (*) [16])(p_Var5 + 0x48)),0x15);
      auVar28._0_8_ = auVar42._0_8_ * auVar29._0_8_;
      auVar28._8_8_ = auVar42._8_8_ * auVar29._8_8_;
      auVar28._16_8_ = auVar42._16_8_ * auVar29._16_8_;
      auVar28._24_8_ = auVar42._24_8_ * auVar29._24_8_;
      auVar18 = vfmadd231pd_fma(auVar28,auVar74,*(undefined1 (*) [32])(p_Var5 + 0x38));
      auVar16 = vunpckhpd_avx(auVar17,auVar59);
      auVar53._24_8_ = *(undefined8 *)(p_Var5 + 0x40);
      auVar53._16_8_ = *(undefined8 *)(p_Var5 + 0x40);
      auVar42 = vblendpd_avx(ZEXT1632(auVar16),auVar71,4);
      auVar42 = vpermpd_avx2(auVar42,0x24);
      auVar18 = vfmadd213pd_fma(auVar53,auVar42,ZEXT1632(auVar18));
      auVar29._16_16_ = auVar17;
      auVar29._0_16_ = auVar16;
      auVar42 = vpermpd_avx2(auVar19,0x11);
      auVar42 = vshufpd_avx(auVar29,auVar42,9);
      auVar17 = vfmadd213pd_fma(auVar42,auVar60,ZEXT1632(auVar18));
      *(undefined1 (*) [32])(local_198._vptr_ChFrame + 0x26) = ZEXT1632(auVar17);
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      local_268 = (local_1f8->
                  super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
      local_260._M_pi =
           (local_1f8->
           super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_260._M_pi)->_M_use_count = (local_260._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_260._M_pi)->_M_use_count = (local_260._M_pi)->_M_use_count + 1;
        }
      }
      ((element_type *)(local_198._vptr_ChFrame + 0x1a))->_vptr_ChElementBase =
           (_func_int **)local_268;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198._vptr_ChFrame + 0x1b),
                 &local_260);
      if (local_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_260._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198.coord.pos.m_data[0] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198.coord.pos.m_data[0]);
      }
      if (local_328.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_328.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar15 = iVar15 + 1;
      lVar14 = lVar14 + 0x10;
    } while (local_210 != lVar14);
  }
  return;
}

Assistant:

void ChBuilderBeamEuler::BuildBeam(std::shared_ptr<ChMesh> mesh,                 // mesh to store the resulting elements
                                   std::shared_ptr<ChBeamSectionEuler> sect,     // section material for beam elements
                                   const int N,                                  // number of elements in the segment
                                   std::shared_ptr<ChNodeFEAxyzrot> nodeA,       // starting point
                                   const ChVector<> B,                           // ending point
                                   const ChVector<> Ydir                         // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(B - nodeA->Frame().GetPos(), Ydir);

    beam_nodes.push_back(nodeA);

    for (int i = 1; i <= N; ++i) {
        double eta = (double)i / (double)N;
        ChVector<> pos = nodeA->Frame().GetPos() + (B - nodeA->Frame().GetPos()) * eta;

        auto nodeBi = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
        mesh->AddNode(nodeBi);
        beam_nodes.push_back(nodeBi);

        auto element = chrono_types::make_shared<ChElementBeamEuler>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i - 1], beam_nodes[i]);

        ChQuaternion<> elrot = mrot.Get_A_quaternion();
        element->SetNodeAreferenceRot(elrot.GetConjugate() % element->GetNodeA()->Frame().GetRot());
        element->SetNodeBreferenceRot(elrot.GetConjugate() % element->GetNodeB()->Frame().GetRot());
        // GetLog() << "Element n." << i << " with rotations: \n";
        // GetLog() << "   Qa=" << element->GetNodeAreferenceRot() << "\n";
        // GetLog() << "   Qb=" << element->GetNodeBreferenceRot() << "\n\n";
        element->SetSection(sect);
    }
}